

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O0

vector<long_long,_std::allocator<long_long>_> *
multiplyPolynomialsNTT
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          vector<long_long,_std::allocator<long_long>_> *a,
          vector<long_long,_std::allocator<long_long>_> *b)

{
  value_type vVar1;
  value_type vVar2;
  size_type sVar3;
  reference plVar4;
  reference pvVar5;
  ulong *puVar6;
  byte bVar7;
  bool bVar8;
  pointer *local_140;
  vector<long_long,_std::allocator<long_long>_> *local_f8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_e0;
  int local_ac;
  allocator<long_long> local_a6;
  undefined1 local_a5;
  int i_1;
  value_type vStack_a0;
  int i;
  ulong local_88;
  long local_80;
  longlong x;
  iterator __end2;
  iterator __begin2;
  vector<long_long,_std::allocator<long_long>_> *__range2;
  undefined1 local_58 [4];
  int j;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> v [2];
  int k;
  vector<long_long,_std::allocator<long_long>_> *b_local;
  vector<long_long,_std::allocator<long_long>_> *a_local;
  vector<long_long,_std::allocator<long_long>_> *res;
  
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    bVar7 = (byte)v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size(a);
    bVar8 = true;
    if (sVar3 <= (ulong)(long)(1 << (bVar7 & 0x1f))) {
      bVar7 = (byte)v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size(b);
      bVar8 = (ulong)(long)(1 << (bVar7 & 0x1f)) < sVar3;
    }
    if (!bVar8) break;
    v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  local_e0 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_58;
  do {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector(local_e0);
    local_e0 = local_e0 + 1;
  } while (local_e0 !=
           (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
           &v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage);
  for (__range2._4_4_ = 0; __range2._4_4_ < 2; __range2._4_4_ = __range2._4_4_ + 1) {
    local_f8 = a;
    if (__range2._4_4_ != 0) {
      local_f8 = b;
    }
    __end2 = std::vector<long_long,_std::allocator<long_long>_>::begin(local_f8);
    x = (longlong)std::vector<long_long,_std::allocator<long_long>_>::end(local_f8);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                       *)&x), bVar8) {
      plVar4 = __gnu_cxx::
               __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
               operator*(&__end2);
      local_80 = *plVar4;
      local_88 = (local_80 + 0xc0000001U) % 0xc0000001;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 (local_58 + (long)__range2._4_4_ * 0x18),&local_88);
      __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
      ::operator++(&__end2);
    }
    vStack_a0 = 0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               (local_58 + (long)__range2._4_4_ * 0x18),
               (long)(1 << (v[1].
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 0x1f)),
               &stack0xffffffffffffff60);
    ntt(v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_,
        (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
        (local_58 + (long)__range2._4_4_ * 0x18),false);
  }
  for (i_1 = 0; i_1 < 1 << ((byte)v[1].
                                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f);
      i_1 = i_1 + 1) {
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_58,
                        (long)i_1);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        &v[0].
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i_1);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_58,
                        (long)i_1);
    *pvVar5 = (vVar1 * vVar2) % 0xc0000001;
  }
  ntt(v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_,
      (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_58,true);
  local_a5 = 0;
  bVar7 = v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_1_ & 0x1f;
  std::allocator<long_long>::allocator(&local_a6);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (__return_storage_ptr__,(long)(1 << bVar7),&local_a6);
  std::allocator<long_long>::~allocator(&local_a6);
  for (local_ac = 0;
      local_ac <
      1 << ((byte)v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f);
      local_ac = local_ac + 1) {
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_58,
                        (long)local_ac);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&inv2,(long)v[1].
                                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    vVar2 = *pvVar5;
    puVar6 = (ulong *)std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                (__return_storage_ptr__,(long)local_ac);
    *puVar6 = (vVar1 * vVar2) % 0xc0000001;
  }
  local_a5 = 1;
  local_140 = &v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_140 = local_140 + -3;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_140);
  } while (local_140 != (pointer *)local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<ll> multiplyPolynomialsNTT(vector<ll> &a, vector<ll> &b) {
    int k = 0;
    while ((1 << k) < a.size() || (1 << k) < b.size()) k++;
    k++;
    
    vector<ull> v[2];
    rep(j, 0, 2) {
        for (auto x : (j ? b : a)) v[j].push_back((x + P) % P);
        v[j].resize(1 << k, 0);
        ntt(k, v[j], false);
    }
    
    rep(i, 0, 1 << k) v[0][i] = (v[0][i] * v[1][i]) % P;
    ntt(k, v[0], true);
    vector<ll> res(1 << k);
    rep(i, 0, 1 << k) res[i] = (v[0][i] * inv2[k]) % P;
    return res;
}